

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O1

vector map_remove_all(map m,map_key key)

{
  ulong uVar1;
  bucket pbVar2;
  int iVar3;
  hash hVar4;
  vector v;
  size_t sVar5;
  char *message;
  
  if (m == (map)0x0 || key == (map_key)0x0) {
    log_write_impl_va("metacall",0x159,"map_remove_all",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                      ,LOG_LEVEL_ERROR,"Invalid map remove parameters");
  }
  else {
    hVar4 = (*m->hash_cb)(key);
    uVar1 = m->capacity;
    pbVar2 = m->buckets;
    v = map_get(m,key);
    sVar5 = vector_size(v);
    if (sVar5 == 0) {
      message = "Invalid map bucket remove: %p";
      sVar5 = 0x169;
    }
    else {
      do {
        iVar3 = bucket_remove(pbVar2 + hVar4 % uVar1,m->compare_cb,key,(void **)0x0);
        if (iVar3 != 0) {
          message = "Invalid map bucket remove: %p";
          sVar5 = 0x172;
          goto LAB_001176d0;
        }
        m->count = m->count - 1;
        sVar5 = sVar5 - 1;
      } while (sVar5 != 0);
      iVar3 = map_bucket_realloc(m);
      if (iVar3 == 0) {
        return v;
      }
      message = "Invalid map bucket remove reallocation";
      sVar5 = 0x17c;
    }
LAB_001176d0:
    log_write_impl_va("metacall",sVar5,"map_remove_all",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                      ,LOG_LEVEL_ERROR,message);
    vector_destroy(v);
  }
  return (vector)0x0;
}

Assistant:

vector map_remove_all(map m, map_key key)
{
	map_hash h;
	size_t index, iterator, size;
	bucket b;
	vector v = NULL;

	if (m == NULL || key == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map remove parameters");
		return NULL;
	}

	h = m->hash_cb(key);

	index = h % m->capacity;

	b = &m->buckets[index];

	v = map_get(m, key);

	size = vector_size(v);

	if (size == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map bucket remove: %p", key);
		vector_destroy(v);
		return NULL;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		if (bucket_remove(b, m->compare_cb, key, NULL) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid map bucket remove: %p", key);
			vector_destroy(v);
			return NULL;
		}

		--m->count;
	}

	if (map_bucket_realloc(m) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map bucket remove reallocation");
		vector_destroy(v);
		return NULL;
	}

	return v;
}